

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O1

CATNDepartureSet<unsigned_char> * __thiscall
Centaurus::CATNDepartureSetFactory<unsigned_char>::build_departure_set
          (CATNDepartureSet<unsigned_char> *__return_storage_ptr__,
          CATNDepartureSetFactory<unsigned_char> *this)

{
  pointer pCVar1;
  CATNDeparture<unsigned_char> *pCVar2;
  pointer pRVar3;
  pointer pRVar4;
  bool bVar5;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  pointer pRVar8;
  pointer this_00;
  CATNDeparture<unsigned_char> *t;
  _Base_ptr p_Var9;
  CATNDeparture<unsigned_char> *departure;
  CATNDepartureSet<unsigned_char> *deptset;
  Range<unsigned_char> atomic_range;
  IndexVector borders_for_one_tr;
  set<int,_std::less<int>,_std::allocator<int>_> borders;
  Range<unsigned_char> local_a0;
  _Rb_tree<Centaurus::CATNClosureElement,_Centaurus::CATNClosureElement,_std::_Identity<Centaurus::CATNClosureElement>,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
  local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = (this->m_departures).
            super__Vector_base<Centaurus::CATNDeparture<unsigned_char>,_std::allocator<Centaurus::CATNDeparture<unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->m_departures).
           super__Vector_base<Centaurus::CATNDeparture<unsigned_char>,_std::allocator<Centaurus::CATNDeparture<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this_00 != pCVar1) {
    do {
      CharClass<unsigned_char>::collect_borders((IndexVector *)&local_90,&this_00->m_label);
      p_Var6 = local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_a0._vptr_Range = (_func_int **)&local_60;
      for (p_Var9 = (_Base_ptr)
                    CONCAT44(local_90._M_impl.super__Rb_tree_header._M_header._4_4_,
                             local_90._M_impl.super__Rb_tree_header._M_header._M_color);
          p_Var9 != p_Var6; p_Var9 = (_Base_ptr)&p_Var9->field_0x4) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique_<int_const&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_60,(const_iterator)&local_60._M_impl.super__Rb_tree_header,(int *)p_Var9,
                   (_Alloc_node *)&local_a0);
      }
      if ((void *)CONCAT44(local_90._M_impl.super__Rb_tree_header._M_header._4_4_,
                           local_90._M_impl.super__Rb_tree_header._M_header._M_color) != (void *)0x0
         ) {
        operator_delete((void *)CONCAT44(local_90._M_impl.super__Rb_tree_header._M_header._4_4_,
                                         local_90._M_impl.super__Rb_tree_header._M_header._M_color))
        ;
      }
      this_00 = this_00 + 1;
    } while (this_00 != pCVar1);
  }
  (__return_storage_ptr__->
  super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
  ).
  super__Vector_base<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
  ).
  super__Vector_base<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
  ).
  super__Vector_base<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->_vptr_CATNDepartureSet = (_func_int **)&PTR__CATNDepartureSet_00186678;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
      if ((_Rb_tree_header *)p_Var7 == &local_60._M_impl.super__Rb_tree_header) break;
      local_a0.m_start = (uchar)p_Var9[1]._M_color;
      local_a0.m_end = (uchar)p_Var7[1]._M_color;
      local_a0._vptr_Range = (_func_int **)&PTR__Range_00185eb8;
      local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_90._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_90._M_impl.super__Rb_tree_header._M_header;
      local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
      pCVar2 = (this->m_departures).
               super__Vector_base<Centaurus::CATNDeparture<unsigned_char>,_std::allocator<Centaurus::CATNDeparture<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_90._M_impl.super__Rb_tree_header._M_header._M_right =
           local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      for (departure = (this->m_departures).
                       super__Vector_base<Centaurus::CATNDeparture<unsigned_char>,_std::allocator<Centaurus::CATNDeparture<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; departure != pCVar2;
          departure = departure + 1) {
        pRVar3 = (departure->m_label).m_ranges.
                 super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pRVar4 = (departure->m_label).m_ranges.
                 super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar5 = pRVar3 != pRVar4;
        if (pRVar3 == pRVar4) {
LAB_00148a5c:
          if (bVar5) goto LAB_00148a61;
        }
        else {
          if ((local_a0.m_start < pRVar3->m_start) || (pRVar3->m_end < local_a0.m_end)) {
            pRVar3 = pRVar3 + 1;
            do {
              pRVar8 = pRVar3;
              bVar5 = pRVar8 != pRVar4;
              if (pRVar8 == pRVar4) break;
              pRVar3 = pRVar8 + 1;
            } while ((local_a0.m_start < pRVar8->m_start) || (pRVar8->m_end < local_a0.m_end));
            goto LAB_00148a5c;
          }
LAB_00148a61:
          closure_add(this,(CATNClosure *)&local_90,departure);
        }
      }
      if (local_90._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::
        vector<std::pair<Centaurus::CharClass<unsigned_char>,std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>>,std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>>>>
        ::
        emplace_back<Centaurus::Range<unsigned_char>&,std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>&>
                  ((vector<std::pair<Centaurus::CharClass<unsigned_char>,std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>>,std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>>>>
                    *)&__return_storage_ptr__->
                       super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
                   ,&local_a0,
                   (set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
                    *)&local_90);
      }
      std::
      _Rb_tree<Centaurus::CATNClosureElement,_Centaurus::CATNClosureElement,_std::_Identity<Centaurus::CATNClosureElement>,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
      ::~_Rb_tree(&local_90);
      p_Var9 = p_Var7;
    } while ((_Rb_tree_header *)p_Var7 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return __return_storage_ptr__;
}

Assistant:

CATNDepartureSet<TCHAR> build_departure_set()
    {
        std::set<int> borders;

        for (const auto& t : m_departures)
        {
            IndexVector borders_for_one_tr = t.label().collect_borders();

            borders.insert(borders_for_one_tr.cbegin(), borders_for_one_tr.cend());
        }

        CATNDepartureSet<TCHAR> deptset;

        for (auto i = borders.cbegin(); i != borders.cend();)
        {
            TCHAR atomic_range_start = *i;
            if (++i == borders.cend()) break;
            TCHAR atomic_range_end = *i;

            Range<TCHAR> atomic_range(atomic_range_start, atomic_range_end);

            CATNClosure closure;

            for (const auto& t : m_departures)
            {
                if (t.label().includes(atomic_range))
                {
                    /*if (!closure.empty())
                    {
                        std::wcerr << L"Closure not empty." << std::endl;
                        std::wcerr << closure << std::endl;
                        std::wcerr << t.priority() << std::endl;
                    }
                    if (scan_closure(closure, t.priority()))
                    {
                        closure.emplace(t.path(), t.color(), t.priority());
                    }
                    else
                    {
                        std::wcerr << L"Departure blocked." << std::endl;
                        std::wcerr << closure << std::endl;
                        std::wcerr << t.priority() << std::endl;
                    }*/
                    closure_add(closure, t);
                }
            }

            if (!closure.empty())
            {
                deptset.emplace_back(atomic_range, closure);
            }
        }
        //std::wcout << deptset << std::endl;
        return deptset;
    }